

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

int qstrnicmp(char *str1,char *str2,size_t len)

{
  char cVar1;
  int iVar2;
  int unaff_EBX;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  bool bVar7;
  
  if (str2 == (char *)0x0 || str1 == (char *)0x0) {
    iVar2 = 1;
    if (str1 == (char *)0x0) {
      iVar2 = -(uint)(str2 != (char *)0x0);
    }
    return iVar2;
  }
  if (len != 0) {
    sVar6 = 0;
    while( true ) {
      uVar3 = (uint)str1[sVar6];
      uVar5 = uVar3 + 0x20 & 0xff;
      if (0x19 < uVar3 - 0x41) {
        uVar5 = uVar3;
      }
      uVar4 = (uint)str2[sVar6];
      uVar3 = uVar4 + 0x20 & 0xff;
      if (0x19 < uVar4 - 0x41) {
        uVar3 = uVar4;
      }
      bVar7 = (char)uVar5 == (char)uVar3;
      iVar2 = (uVar5 & 0xff) - (uVar3 & 0xff);
      if (bVar7) {
        iVar2 = unaff_EBX;
      }
      unaff_EBX = iVar2;
      cVar1 = (str1[sVar6] == '\0') * '\x02';
      if (!bVar7) {
        cVar1 = '\x01';
      }
      if (cVar1 != '\0') break;
      sVar6 = sVar6 + 1;
      if (len == sVar6) {
        return 0;
      }
    }
    if (cVar1 == '\x02') {
      return 0;
    }
    return unaff_EBX;
  }
  return 0;
}

Assistant:

int qstrnicmp(const char *str1, const char *str2, size_t len)
{
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !s2)
        return s1 ? 1 : (s2 ? -1 : 0);
    for (; len--; ++s1, ++s2) {
        const uchar c = *s1;
        if (int res = QtMiscUtils::caseCompareAscii(c, *s2))
            return res;
        if (!c)                                // strings are equal
            break;
    }
    return 0;
}